

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O3

void deqp::gles3::Functional::DepthStencilCaseUtil::getStencilTestValues
               (int stencilBits,int numValues,int *values)

{
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar1 = _DAT_00ad8f80;
  uVar6 = numValues / 2;
  if (1 < numValues) {
    lVar3 = (ulong)uVar6 - 1;
    auVar7._8_4_ = (int)lVar3;
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar7 = auVar7 ^ _DAT_00ad8f80;
    auVar8 = _DAT_00ada920;
    do {
      auVar9 = auVar8 ^ auVar1;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        values[uVar4] = (int)uVar4;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        values[uVar4 + 1] = (int)uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar3 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar3 + 2;
    } while ((uVar6 + 1 & 0x7ffffffe) != uVar4);
  }
  if (0 < (int)(numValues - uVar6)) {
    uVar2 = ~(-1 << ((byte)stencilBits & 0x1f));
    uVar4 = (ulong)(numValues - uVar6);
    iVar5 = numValues + -1;
    do {
      values[iVar5] = uVar2;
      uVar2 = uVar2 - 1;
      iVar5 = iVar5 + -1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void getStencilTestValues (int stencilBits, int numValues, int* values)
{
	int numLowest		= numValues/2;
	int	numHighest		= numValues-numLowest;
	int	maxVal			= (1<<stencilBits)-1;

	for (int ndx = 0; ndx < numLowest; ndx++)
		values[ndx] = ndx;

	for (int ndx = 0; ndx < numHighest; ndx++)
		values[numValues-ndx-1] = maxVal-ndx;
}